

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O2

bool __thiscall EOClient::Upload(EOClient *this,FileType type,int id,InitReply init_reply)

{
  _List_node_base *p_Var1;
  pointer puVar2;
  uint uVar3;
  bool bVar4;
  mapped_type *this_00;
  ulong uVar5;
  size_t file_start;
  undefined7 in_register_00000031;
  size_t file_length;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar6;
  allocator<char> local_1b9;
  string filename;
  char mapbuf [7];
  key_type local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  ECF local_130;
  ESF local_f8;
  ENF local_c0;
  EIF local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->upload_file_id = id;
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  switch((int)CONCAT71(in_register_00000031,type)) {
  case 1:
    uVar3 = -id;
    if (0 < id) {
      uVar3 = id;
    }
    sprintf(mapbuf,"%05i",(ulong)uVar3);
    p_Var1 = (this->super_Client).server[1].clients.
             super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
             super__List_node_base._M_prev;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"MapDir",&local_1b9);
    this_00 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&p_Var1[0x19]._M_prev,&local_190);
    util::variant::GetString_abi_cxx11_(&local_170,this_00);
    std::operator+(&local_150,&local_170,mapbuf);
    std::operator+(&local_50,&local_150,".emf");
    std::__cxx11::string::operator=((string *)&filename,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
  default:
    file_start = 0;
    file_length = 0;
    goto LAB_00127220;
  case 2:
    EIF::EIF(&local_88,
             (EIF *)(this->super_Client).server[1].clients.
                    super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                    super__List_node_base._M_prev[0x16]._M_next);
    if (local_88.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_88.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      bVar4 = false;
    }
    else if (((long)local_88.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_88.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x38) &&
            (0x10 < (ulong)((long)((local_88.files.
                                    super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                                    super__Vector_impl_data._M_start)->splits).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)((local_88.files.
                                   super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                                   super__Vector_impl_data._M_start)->splits).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start))) {
      std::__cxx11::string::_M_assign((string *)&filename);
      pvVar6 = &(local_88.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                 super__Vector_impl_data._M_start)->splits;
      bVar4 = true;
    }
    else {
      pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      bVar4 = false;
      if ((-1 < (int)(id - 1U)) &&
         ((ulong)(id - 1U) <=
          (ulong)(((long)local_88.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_88.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x38))) {
        std::__cxx11::string::_M_assign((string *)&filename);
        bVar4 = true;
        pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      }
    }
    EIF::~EIF(&local_88);
    break;
  case 3:
    ENF::ENF(&local_c0,
             (ENF *)(this->super_Client).server[1].clients.
                    super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                    super__List_node_base._M_prev[0x16]._M_prev);
    if (local_c0.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_c0.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      bVar4 = false;
    }
    else if (((long)local_c0.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_c0.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x38) &&
            (0x10 < (ulong)((long)((local_c0.files.
                                    super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                                    super__Vector_impl_data._M_start)->splits).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)((local_c0.files.
                                   super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                                   super__Vector_impl_data._M_start)->splits).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start))) {
      std::__cxx11::string::_M_assign((string *)&filename);
      pvVar6 = &(local_c0.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                 super__Vector_impl_data._M_start)->splits;
      bVar4 = true;
    }
    else {
      pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      bVar4 = false;
      if ((-1 < (int)(id - 1U)) &&
         ((ulong)(id - 1U) <=
          (ulong)(((long)local_c0.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_c0.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x38))) {
        std::__cxx11::string::_M_assign((string *)&filename);
        bVar4 = true;
        pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      }
    }
    ENF::~ENF(&local_c0);
    break;
  case 4:
    ESF::ESF(&local_f8,
             (ESF *)(this->super_Client).server[1].clients.
                    super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                    super__List_node_base._M_prev[0x17]._M_next);
    if (local_f8.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_f8.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      bVar4 = false;
    }
    else if (((long)local_f8.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_f8.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x38) &&
            (0x10 < (ulong)((long)((local_f8.files.
                                    super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                                    super__Vector_impl_data._M_start)->splits).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)((local_f8.files.
                                   super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                                   super__Vector_impl_data._M_start)->splits).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start))) {
      std::__cxx11::string::_M_assign((string *)&filename);
      pvVar6 = &(local_f8.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                 super__Vector_impl_data._M_start)->splits;
      bVar4 = true;
    }
    else {
      pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      bVar4 = false;
      if ((-1 < (int)(id - 1U)) &&
         ((ulong)(id - 1U) <=
          (ulong)(((long)local_f8.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_f8.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x38))) {
        std::__cxx11::string::_M_assign((string *)&filename);
        bVar4 = true;
        pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      }
    }
    ESF::~ESF(&local_f8);
    break;
  case 5:
    ECF::ECF(&local_130,
             (ECF *)(this->super_Client).server[1].clients.
                    super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                    super__List_node_base._M_prev[0x17]._M_prev);
    if (local_130.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_130.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      bVar4 = false;
    }
    else if (((long)local_130.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_130.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x38) &&
            (0x10 < (ulong)((long)((local_130.files.
                                    super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                                    super__Vector_impl_data._M_start)->splits).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)((local_130.files.
                                   super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                                   super__Vector_impl_data._M_start)->splits).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start))) {
      std::__cxx11::string::_M_assign((string *)&filename);
      pvVar6 = &(local_130.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                 super__Vector_impl_data._M_start)->splits;
      bVar4 = true;
    }
    else {
      pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      bVar4 = false;
      if ((-1 < (int)(id - 1U)) &&
         ((ulong)(id - 1U) <=
          (ulong)(((long)local_130.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_130.files.super__Vector_base<Pub_File,_std::allocator<Pub_File>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x38))) {
        std::__cxx11::string::_M_assign((string *)&filename);
        bVar4 = true;
        pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      }
    }
    ECF::~ECF(&local_130);
  }
  if (bVar4) {
    if (pvVar6 == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
      file_start = 0;
      file_length = 0;
LAB_00127220:
      bVar4 = Upload(this,type,&filename,file_start,file_length,init_reply);
      goto LAB_00127237;
    }
    if (0 < id) {
      uVar5 = (ulong)(uint)id;
      puVar2 = (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar5 < (ulong)((long)(pvVar6->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3)) {
        file_start = puVar2[uVar5 - 1];
        file_length = puVar2[uVar5] - file_start;
        goto LAB_00127220;
      }
    }
  }
  bVar4 = false;
LAB_00127237:
  std::__cxx11::string::~string((string *)&filename);
  return bVar4;
}

Assistant:

bool EOClient::Upload(FileType type, int id, InitReply init_reply)
{
	this->upload_file_id = id;

	std::string filename;
	std::size_t file_start = 0;
	std::size_t file_length = 0;

	std::vector<std::size_t>* file_splits = nullptr;

	auto load_file_splits = [&](auto pub)
	{
		if (pub.files.empty())
			return false;

		Pub_File& first_file = pub.files[0];

		if (pub.files.size() == 1 && first_file.splits.size() > 2)
		{
			filename = first_file.filename;
			file_splits = &first_file.splits;
		}
		else
		{
			if (id - 1 < 0 || id - 1 > pub.files.size())
				return false;

			filename = pub.files[id - 1].filename;
		}

		return true;
	};

	if (type == FILE_MAP)
	{
		char mapbuf[7];
		std::sprintf(mapbuf, "%05i", int(std::abs(id)));
		filename = std::string(server()->world->config["MapDir"]) + mapbuf + ".emf";
	}
	else if (type == FILE_ITEM)
	{
		if (!load_file_splits(*this->server()->world->eif))
			return false;
	}
	else if (type == FILE_NPC)
	{
		if (!load_file_splits(*this->server()->world->enf))
			return false;
	}
	else if (type == FILE_SPELL)
	{
		if (!load_file_splits(*this->server()->world->esf))
			return false;
	}
	else if (type == FILE_CLASS)
	{
		if (!load_file_splits(*this->server()->world->ecf))
			return false;
	}

	if (file_splits)
	{
		if (id < 1 || id >= file_splits->size())
			return false;

		file_start = (*file_splits)[id - 1];
		file_length = (*file_splits)[id] - file_start;
	}

	return EOClient::Upload(type, filename, file_start, file_length, init_reply);
}